

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV __thiscall
SoftHSM::C_Digest(SoftHSM *this,CK_SESSION_HANDLE hSession,CK_BYTE_PTR pData,CK_ULONG ulDataLen,
                 CK_BYTE_PTR pDigest,CK_ULONG_PTR pulDigestLen)

{
  int iVar1;
  uint uVar2;
  HashAlgorithm *pHVar3;
  size_t sVar4;
  Session *this_00;
  long in_RDX;
  long in_RDI;
  ByteString *in_R8;
  ulong *in_R9;
  ByteString digest;
  ByteString data;
  CK_ULONG size;
  Session *session;
  Session *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  uchar *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  undefined1 local_a8 [8];
  CK_SESSION_HANDLE in_stack_ffffffffffffff60;
  HandleManager *in_stack_ffffffffffffff68;
  undefined1 local_70 [40];
  ulong local_48;
  Session *local_40;
  ulong *local_38;
  ByteString *local_30;
  CK_RV local_8;
  
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    local_8 = 400;
  }
  else if (in_R9 == (ulong *)0x0) {
    local_8 = 7;
  }
  else if (in_RDX == 0) {
    local_8 = 7;
  }
  else {
    local_38 = in_R9;
    local_30 = in_R8;
    local_40 = (Session *)
               HandleManager::getSession(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    if (local_40 == (Session *)0x0) {
      local_8 = 0xb3;
    }
    else {
      iVar1 = Session::getOpType(local_40);
      if (iVar1 == 4) {
        pHVar3 = Session::getDigestOp(local_40);
        iVar1 = (*pHVar3->_vptr_HashAlgorithm[5])();
        local_48 = (ulong)iVar1;
        if (local_30 == (ByteString *)0x0) {
          *local_38 = local_48;
          local_8 = 0;
        }
        else if (*local_38 < local_48) {
          *local_38 = local_48;
          local_8 = 0x150;
        }
        else {
          ByteString::ByteString
                    ((ByteString *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                     in_stack_ffffffffffffff38,
                     CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
          pHVar3 = Session::getDigestOp(local_40);
          uVar2 = (*pHVar3->_vptr_HashAlgorithm[3])(pHVar3,local_70);
          if ((uVar2 & 1) == 0) {
            Session::resetOp(in_stack_ffffffffffffff20);
            local_8 = 5;
          }
          else {
            ByteString::ByteString((ByteString *)0x16cd82);
            pHVar3 = Session::getDigestOp(local_40);
            uVar2 = (*pHVar3->_vptr_HashAlgorithm[4])(pHVar3,local_a8);
            if ((uVar2 & 1) == 0) {
              Session::resetOp(in_stack_ffffffffffffff20);
              local_8 = 5;
            }
            else {
              sVar4 = ByteString::size((ByteString *)0x16ce0e);
              if (sVar4 == local_48) {
                this_00 = (Session *)ByteString::byte_str(local_30);
                memcpy(local_30,this_00,local_48);
                *local_38 = local_48;
                Session::resetOp(this_00);
                local_8 = 0;
              }
              else {
                softHSMLog(3,"C_Digest",
                           "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                           ,0xe9f,"The size of the digest differ from the size of the mechanism");
                Session::resetOp(in_stack_ffffffffffffff20);
                local_8 = 5;
              }
            }
            ByteString::~ByteString((ByteString *)0x16cee4);
          }
          ByteString::~ByteString((ByteString *)0x16ceee);
        }
      }
      else {
        local_8 = 0x91;
      }
    }
  }
  return local_8;
}

Assistant:

CK_RV SoftHSM::C_Digest(CK_SESSION_HANDLE hSession, CK_BYTE_PTR pData, CK_ULONG ulDataLen, CK_BYTE_PTR pDigest, CK_ULONG_PTR pulDigestLen)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pulDigestLen == NULL_PTR) return CKR_ARGUMENTS_BAD;
	if (pData == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Check if we are doing the correct operation
	if (session->getOpType() != SESSION_OP_DIGEST) return CKR_OPERATION_NOT_INITIALIZED;

	// Return size
	CK_ULONG size = session->getDigestOp()->getHashSize();
	if (pDigest == NULL_PTR)
	{
		*pulDigestLen = size;
		return CKR_OK;
	}

	// Check buffer size
	if (*pulDigestLen < size)
	{
		*pulDigestLen = size;
		return CKR_BUFFER_TOO_SMALL;
	}

	// Get the data
	ByteString data(pData, ulDataLen);

	// Digest the data
	if (session->getDigestOp()->hashUpdate(data) == false)
	{
		session->resetOp();
		return CKR_GENERAL_ERROR;
	}

	// Get the digest
	ByteString digest;
	if (session->getDigestOp()->hashFinal(digest) == false)
	{
		session->resetOp();
		return CKR_GENERAL_ERROR;
	}

	// Check size
	if (digest.size() != size)
	{
		ERROR_MSG("The size of the digest differ from the size of the mechanism");
		session->resetOp();
		return CKR_GENERAL_ERROR;
	}
	memcpy(pDigest, digest.byte_str(), size);
	*pulDigestLen = size;

	session->resetOp();

	return CKR_OK;
}